

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O1

int __thiscall
jrtplib::RTCPPacketBuilder::FillInReportBlocks
          (RTCPPacketBuilder *this,RTCPCompoundPacketBuilder *rtcpcomppack,RTPTime *curtime,
          int maxcount,bool *full,int *added,int *skipped,bool *atendoflist)

{
  uint32_t *puVar1;
  double dVar2;
  uint32_t exthighestseq;
  RTPNTPTime RVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint32_t lsr;
  int iVar7;
  RTPSourceData *pRVar8;
  uint uVar9;
  uint8_t fractionlost;
  int iVar10;
  uint32_t dlsr;
  bool bVar11;
  bool bVar12;
  int local_5c;
  int local_58;
  
  bVar4 = RTPSources::GotoFirstSource(this->sources);
  bVar11 = false;
  bVar6 = false;
  iVar10 = 0;
  local_5c = 0;
  if (bVar4) {
    bVar11 = false;
    bVar6 = false;
    bVar4 = false;
    iVar10 = 0;
    local_5c = 0;
    do {
      pRVar8 = RTPSources::GetCurrentSourceInfo(this->sources);
      if ((((pRVar8->ownssrc != false) || (pRVar8->iscsrc != false)) ||
          ((pRVar8->stats).sentdata != true)) ||
         ((this->firstpacket == false &&
          (dVar2 = (pRVar8->stats).lastrtptime.m_t,
          dVar2 < (this->prevbuildtime).m_t || dVar2 == (this->prevbuildtime).m_t)))) {
LAB_0012c5e9:
        bVar12 = true;
        if ((!bVar4) && (bVar5 = RTPSources::GotoNextSource(this->sources), !bVar5)) {
          bVar11 = true;
          bVar4 = true;
        }
      }
      else {
        if (pRVar8->processedinrtcp == true) {
          iVar10 = iVar10 + 1;
          goto LAB_0012c5e9;
        }
        exthighestseq = (pRVar8->stats).exthighseqnr;
        uVar9 = exthighestseq - (pRVar8->stats).savedextseqnr;
        lsr = 0;
        fractionlost = '\0';
        puVar1 = &(pRVar8->stats).numnewpackets;
        if (*puVar1 <= uVar9) {
          fractionlost = (uint8_t)(int)(((double)(uVar9 - *puVar1) / (double)uVar9) * 256.0);
        }
        dlsr = 0;
        if ((pRVar8->SRinf).hasinfo == true) {
          RVar3 = (pRVar8->SRinf).ntptimestamp;
          lsr = RVar3.lsw >> 0x10 | RVar3.msw << 0x10;
          dlsr = (uint32_t)(long)((curtime->m_t - (pRVar8->SRinf).receivetime.m_t) * 65536.0);
        }
        iVar7 = RTCPCompoundPacketBuilder::AddReportBlock
                          (rtcpcomppack,pRVar8->ssrc,fractionlost,
                           exthighestseq -
                           ((pRVar8->stats).baseseqnr + (pRVar8->stats).packetsreceived),
                           exthighestseq,(pRVar8->stats).jitter,lsr,dlsr);
        if (iVar7 < 0) {
          bVar12 = iVar7 == -0x2b;
          if (bVar12) {
            bVar6 = true;
            bVar4 = true;
            iVar7 = local_58;
          }
        }
        else {
          local_5c = local_5c + 1;
          if (maxcount <= local_5c) {
            bVar4 = RTPSources::GotoNextSource(this->sources);
            if (!bVar4) {
              bVar11 = true;
            }
            bVar4 = true;
          }
          (pRVar8->stats).numnewpackets = 0;
          (pRVar8->stats).savedextseqnr = (pRVar8->stats).exthighseqnr;
          pRVar8->processedinrtcp = true;
          bVar12 = true;
          iVar7 = local_58;
        }
        local_58 = iVar7;
        if (bVar12) goto LAB_0012c5e9;
        bVar12 = false;
      }
      if (!bVar12) {
        return local_58;
      }
    } while (!bVar4);
  }
  *added = local_5c;
  *skipped = iVar10;
  *full = bVar6;
  if (!bVar11) {
    bVar4 = false;
    do {
      pRVar8 = RTPSources::GetCurrentSourceInfo(this->sources);
      bVar6 = bVar4;
      if ((((pRVar8->ownssrc == false) && (pRVar8->iscsrc == false)) &&
          ((pRVar8->stats).sentdata == true)) &&
         ((bVar6 = true, this->firstpacket == false &&
          (dVar2 = (pRVar8->stats).lastrtptime.m_t, bVar6 = bVar4,
          (this->prevbuildtime).m_t <= dVar2 && dVar2 != (this->prevbuildtime).m_t)))) {
        bVar6 = true;
      }
      bVar4 = bVar6;
      if ((bVar4) && (pRVar8->processedinrtcp != false)) {
        bVar4 = false;
      }
      if ((!bVar4) && (bVar6 = RTPSources::GotoNextSource(this->sources), !bVar6)) {
        bVar11 = true;
      }
    } while (bVar11 == false && !bVar4);
  }
  *atendoflist = bVar11;
  return 0;
}

Assistant:

int RTCPPacketBuilder::FillInReportBlocks(RTCPCompoundPacketBuilder *rtcpcomppack,const RTPTime &curtime,int maxcount,bool *full,int *added,int *skipped,bool *atendoflist)
{
	RTPSourceData *srcdat;
	int addedcount = 0;
	int skippedcount = 0;
	bool done = false;
	bool filled = false;
	bool atend = false;
	int status;

	if (sources.GotoFirstSource())
	{
		do
		{
			bool shouldprocess = false;
			
			srcdat = sources.GetCurrentSourceInfo();
			if (!srcdat->IsOwnSSRC()) // don't send to ourselves
			{
				if (!srcdat->IsCSRC()) // p 35: no reports should go to CSRCs
				{
					if (srcdat->INF_HasSentData()) // if this isn't true, INF_GetLastRTPPacketTime() won't make any sense
					{
						if (firstpacket)
							shouldprocess = true;
						else
						{
							// p 35: only if rtp packets were received since the last RTP packet, a report block
							// should be added
							
							RTPTime lastrtptime = srcdat->INF_GetLastRTPPacketTime();
							
							if (lastrtptime > prevbuildtime)
								shouldprocess = true;
						}
					}
				}
			}

			if (shouldprocess)
			{
				if (srcdat->IsProcessedInRTCP()) // already covered this one
				{
					skippedcount++;
				}
				else
				{
					uint32_t rr_ssrc = srcdat->GetSSRC();
					uint32_t num = srcdat->INF_GetNumPacketsReceivedInInterval();
					uint32_t prevseq = srcdat->INF_GetSavedExtendedSequenceNumber();
					uint32_t curseq = srcdat->INF_GetExtendedHighestSequenceNumber();
					uint32_t expected = curseq-prevseq;
					uint8_t fraclost;
					
					if (expected < num) // got duplicates
						fraclost = 0;
					else
					{
						double lost = (double)(expected-num);
						double frac = lost/((double)expected);
						fraclost = (uint8_t)(frac*256.0);
					}

					expected = curseq-srcdat->INF_GetBaseSequenceNumber();
					num = srcdat->INF_GetNumPacketsReceived();

					uint32_t diff = expected-num;
					int32_t *packlost = (int32_t *)&diff;
					
					uint32_t jitter = srcdat->INF_GetJitter();
					uint32_t lsr;
					uint32_t dlsr; 	

					if (!srcdat->SR_HasInfo())
					{
						lsr = 0;
						dlsr = 0;
					}
					else
					{
						RTPNTPTime srtime = srcdat->SR_GetNTPTimestamp();
						uint32_t m = (srtime.GetMSW()&0xFFFF);
						uint32_t l = ((srtime.GetLSW()>>16)&0xFFFF);
						lsr = ((m<<16)|l);

						RTPTime diff = curtime;
						diff -= srcdat->SR_GetReceiveTime();
						double diff2 = diff.GetDouble();
						diff2 *= 65536.0;
						dlsr = (uint32_t)diff2;
					}

					status = rtcpcomppack->AddReportBlock(rr_ssrc,fraclost,*packlost,curseq,jitter,lsr,dlsr);
					if (status < 0)
					{
						if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
						{
							done = true;
							filled = true;
						}
						else
							return status;
					}
					else
					{
						addedcount++;
						if (addedcount >= maxcount)
						{
							done = true;
							if (!sources.GotoNextSource())
								atend = true;
						}
						srcdat->INF_StartNewInterval();
						srcdat->SetProcessedInRTCP(true);
					}
				}
			}

			if (!done)
			{
				if (!sources.GotoNextSource())
				{
					atend = true;
					done = true;
				}
			}

		} while (!done);
	}
	
	*added = addedcount;
	*skipped = skippedcount;
	*full = filled;
	
	if (!atend) // search for available sources
	{
		bool shouldprocess = false;
		
		do
		{	
			srcdat = sources.GetCurrentSourceInfo();
			if (!srcdat->IsOwnSSRC()) // don't send to ourselves
			{
				if (!srcdat->IsCSRC()) // p 35: no reports should go to CSRCs
				{
					if (srcdat->INF_HasSentData()) // if this isn't true, INF_GetLastRTPPacketTime() won't make any sense
					{
						if (firstpacket)
							shouldprocess = true;
						else
						{
							// p 35: only if rtp packets were received since the last RTP packet, a report block
							// should be added
							
							RTPTime lastrtptime = srcdat->INF_GetLastRTPPacketTime();
							
							if (lastrtptime > prevbuildtime)
								shouldprocess = true;
						}
					}
				}
			}
			
			if (shouldprocess)
			{
				if (srcdat->IsProcessedInRTCP())
					shouldprocess = false;
			}

			if (!shouldprocess)
			{
				if (!sources.GotoNextSource())
					atend = true;
			}
	
		} while (!atend && !shouldprocess);
	}	

	*atendoflist = atend;
	return 0;	
}